

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O1

void test_qpixl_frqi_compressedFRQICircuit<double>(void)

{
  vector<double,_std::allocator<double>_> *a_00;
  vector<double,_std::allocator<double>_> *a_01;
  vector<double,_std::allocator<double>_> *a_02;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  SquareMatrix<double> circC_check;
  SquareMatrix<double> circB_check;
  SquareMatrix<double> circA_check;
  QCircuit<double,_qclab::QObject<double>_> circC;
  vector<double,_std::allocator<double>_> c;
  vector<double,_std::allocator<double>_> b;
  vector<double,_std::allocator<double>_> a;
  QCircuit<double,_qclab::QObject<double>_> circB;
  QCircuit<double,_qclab::QObject<double>_> circA;
  SquareMatrix<double> local_158;
  SquareMatrix<double> local_148;
  SquareMatrix<double> local_138;
  undefined1 local_128 [16];
  undefined1 local_118 [8];
  __uniq_ptr_impl<double,_std::default_delete<double[]>_> _Stack_110;
  pointer local_108;
  vector<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
  vStack_100;
  undefined8 local_e8;
  undefined8 uStack_e0;
  vector<double,_std::allocator<double>_> local_d8;
  vector<double,_std::allocator<double>_> local_c0;
  void *local_a8 [2];
  long local_98;
  QCircuit<double,_qclab::QObject<double>_> local_90;
  QCircuit<double,_qclab::QObject<double>_> local_60;
  
  local_118 = (undefined1  [8])0x3fe0000000000000;
  _Stack_110._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (tuple<double_*,_std::default_delete<double[]>_>)
       (_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)0x3ff0000000000000;
  __l._M_len = 2;
  __l._M_array = (iterator)local_118;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_a8,__l,(allocator_type *)&local_60);
  qpixl::frqi::compressedFRQICircuit<std::vector<double,std::allocator<double>>>
            (&local_60,(frqi *)local_a8,a_00,0.0);
  local_138.size_ = 4;
  local_138.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)operator_new__(0x80);
  *(double *)
   local_138.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
   super__Head_base<0UL,_double_*,_false>._M_head_impl = 0.620544580563746;
  *(double *)
   ((long)local_138.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) = 0.339005049421045;
  *(double *)
   ((long)local_138.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10) = 0.38205142437009;
  *(double *)
   ((long)local_138.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18) = 0.595009839529386;
  *(double *)
   ((long)local_138.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20) = -0.339005049421045;
  *(double *)
   ((long)local_138.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x28) = 0.620544580563746;
  *(double *)
   ((long)local_138.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30) = -0.595009839529386;
  *(double *)
   ((long)local_138.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x38) = 0.38205142437009;
  *(double *)
   ((long)local_138.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40) = 0.620544580563746;
  *(double *)
   ((long)local_138.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x48) = 0.339005049421045;
  *(double *)
   ((long)local_138.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x50) = -0.38205142437009;
  *(double *)
   ((long)local_138.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x58) = -0.595009839529386;
  *(double *)
   ((long)local_138.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x60) = -0.339005049421045;
  *(double *)
   ((long)local_138.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x68) = 0.620544580563746;
  *(double *)
   ((long)local_138.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x70) = 0.595009839529386;
  *(double *)
   ((long)local_138.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x78) = -0.38205142437009;
  qclab::QCircuit<double,_qclab::QObject<double>_>::matrix
            ((QCircuit<double,_qclab::QObject<double>_> *)local_118);
  test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>,double>
            ((SquareMatrix<double> *)local_118,&local_138,2.220446049250313e-15);
  if (_Stack_110._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)0x0) {
    operator_delete__((void *)_Stack_110._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  local_108 = (pointer)&DAT_3ff8000000000000;
  vStack_100.
  super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_4000000000000000;
  local_118 = (undefined1  [8])0x3fe0000000000000;
  _Stack_110._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (tuple<double_*,_std::default_delete<double[]>_>)
       (_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)0x3ff0000000000000;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)local_118;
  std::vector<double,_std::allocator<double>_>::vector(&local_c0,__l_00,(allocator_type *)&local_90)
  ;
  qpixl::frqi::compressedFRQICircuit<std::vector<double,std::allocator<double>>>
            (&local_90,(frqi *)&local_c0,a_01,0.0);
  local_148.size_ = 8;
  local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)operator_new__(0x200);
  *(double *)
   local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
   super__Head_base<0UL,_double_*,_false>._M_head_impl = 0.438791280945186;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) = 0.239712769302101;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10) = 0.27015115293407;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18) = 0.420735492403948;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20) = 0.035368600833851;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x28) = 0.498747493302027;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30) = -0.208073418273571;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x38) = 0.454648713412841;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40) = -0.239712769302101;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x48) = 0.438791280945186;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x50) = -0.420735492403948;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x58) = 0.27015115293407;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x60) = -0.498747493302027;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x68) = 0.035368600833851;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x70) = -0.454648713412841;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x78) = -0.208073418273571;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x80) = 0.438791280945186;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x88) = 0.239712769302101;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x90) = -0.27015115293407;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x98) = -0.420735492403948;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xa0) = 0.035368600833851;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xa8) = 0.498747493302027;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xb0) = 0.208073418273571;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xb8) = -0.454648713412841;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xc0) = -0.239712769302101;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 200) = 0.438791280945186;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xd0) = 0.420735492403948;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xd8) = -0.27015115293407;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xe0) = -0.498747493302027;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xe8) = 0.035368600833851;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xf0) = 0.454648713412841;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xf8) = 0.208073418273571;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x100) = 0.438791280945186;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x108) = 0.239712769302101;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x110) = 0.27015115293407;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x118) = 0.420735492403948;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x120) = -0.035368600833851;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x128) = -0.498747493302027;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x130) = 0.208073418273571;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x138) = -0.454648713412841;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x140) = -0.239712769302101;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x148) = 0.438791280945186;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x150) = -0.420735492403948;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x158) = 0.27015115293407;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x160) = 0.498747493302027;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x168) = -0.035368600833851;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x170) = 0.454648713412841;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x178) = 0.208073418273571;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x180) = 0.438791280945186;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x188) = 0.239712769302101;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 400) = -0.27015115293407;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x198) = -0.420735492403948;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1a0) = -0.035368600833851;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1a8) = -0.498747493302027;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1b0) = -0.208073418273571;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1b8) = 0.454648713412841;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1c0) = -0.239712769302101;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1c8) = 0.438791280945186;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1d0) = 0.420735492403948;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1d8) = -0.27015115293407;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1e0) = 0.498747493302027;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1e8) = -0.035368600833851;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1f0) = -0.454648713412841;
  *(double *)
   ((long)local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1f8) = -0.208073418273571;
  qclab::QCircuit<double,_qclab::QObject<double>_>::matrix
            ((QCircuit<double,_qclab::QObject<double>_> *)local_118);
  test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>,double>
            ((SquareMatrix<double> *)local_118,&local_148,2.220446049250313e-15);
  if (_Stack_110._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)0x0) {
    operator_delete__((void *)_Stack_110._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  local_e8 = 0x400c000000000000;
  uStack_e0 = 0x4010000000000000;
  vStack_100.
  super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4004000000000000;
  vStack_100.
  super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x4008000000000000;
  local_108 = (pointer)&DAT_3ff8000000000000;
  vStack_100.
  super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_4000000000000000;
  local_118 = (undefined1  [8])0x3fe0000000000000;
  _Stack_110._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (tuple<double_*,_std::default_delete<double[]>_>)
       (_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)0x3ff0000000000000;
  __l_01._M_len = 8;
  __l_01._M_array = (iterator)local_118;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_d8,__l_01,(allocator_type *)&local_158);
  qpixl::frqi::compressedFRQICircuit<std::vector<double,std::allocator<double>>>
            ((QCircuit<double,_qclab::QObject<double>_> *)local_118,(frqi *)&local_d8,a_02,0.0);
  local_158.size_ = 0x10;
  local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)operator_new__(0x800);
  *(double *)
   local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
   super__Head_base<0UL,_double_*,_false>._M_head_impl = 0.310272290281873;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) = 0.169502524710522;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10) = 0.191025712185045;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18) = 0.297504919764693;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20) = 0.025009377490697;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x28) = 0.352667734613656;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30) = -0.147130125045907;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x38) = 0.321485188311959;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40) = -0.283247041628773;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x48) = 0.21159185572358;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x50) = -0.350015203834987;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x58) = 0.049893457330116;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x60) = -0.331087436935406;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x68) = -0.124020599512917;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x70) = -0.231097918395994;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x78) = -0.267570088225568;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x80) = -0.169502524710522;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x88) = 0.310272290281873;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x90) = -0.297504919764693;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x98) = 0.191025712185045;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xa0) = -0.352667734613656;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xa8) = 0.025009377490697;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xb0) = -0.321485188311959;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xb8) = -0.147130125045907;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xc0) = -0.21159185572358;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 200) = -0.283247041628773;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xd0) = -0.049893457330116;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xd8) = -0.350015203834987;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xe0) = 0.124020599512917;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xe8) = -0.331087436935406;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xf0) = 0.267570088225568;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xf8) = -0.231097918395994;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x100) = 0.310272290281873;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x108) = 0.169502524710522;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x110) = -0.191025712185045;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x118) = -0.297504919764693;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x120) = 0.025009377490697;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x128) = 0.352667734613656;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x130) = 0.147130125045907;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x138) = -0.321485188311959;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x140) = -0.283247041628773;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x148) = 0.21159185572358;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x150) = 0.350015203834987;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x158) = -0.049893457330116;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x160) = -0.331087436935406;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x168) = -0.124020599512917;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x170) = 0.231097918395994;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x178) = 0.267570088225568;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x180) = -0.169502524710522;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x188) = 0.310272290281873;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 400) = 0.297504919764693;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x198) = -0.191025712185045;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1a0) = -0.352667734613656;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1a8) = 0.025009377490697;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1b0) = 0.321485188311959;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1b8) = 0.147130125045907;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1c0) = -0.21159185572358;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1c8) = -0.283247041628773;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1d0) = 0.049893457330116;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1d8) = 0.350015203834987;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1e0) = 0.124020599512917;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1e8) = -0.331087436935406;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1f0) = -0.267570088225568;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x1f8) = 0.231097918395994;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x200) = 0.310272290281873;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x208) = 0.169502524710522;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x210) = 0.191025712185045;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x218) = 0.297504919764693;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x220) = -0.025009377490697;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x228) = -0.352667734613656;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x230) = 0.147130125045907;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x238) = -0.321485188311959;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x240) = -0.283247041628773;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x248) = 0.21159185572358;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x250) = -0.350015203834987;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 600) = 0.049893457330116;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x260) = 0.331087436935406;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x268) = 0.124020599512917;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x270) = 0.231097918395994;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x278) = 0.267570088225568;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x280) = -0.169502524710522;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x288) = 0.310272290281873;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x290) = -0.297504919764693;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x298) = 0.191025712185045;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x2a0) = 0.352667734613656;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x2a8) = -0.025009377490697;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x2b0) = 0.321485188311959;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x2b8) = 0.147130125045907;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x2c0) = -0.21159185572358;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x2c8) = -0.283247041628773;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x2d0) = -0.049893457330116;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x2d8) = -0.350015203834987;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x2e0) = -0.124020599512917;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x2e8) = 0.331087436935406;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x2f0) = -0.267570088225568;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x2f8) = 0.231097918395994;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x300) = 0.310272290281873;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x308) = 0.169502524710522;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 6 + 2) * 8) =
       -0.191025712185045;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 6 + 3) * 8) =
       -0.297504919764693;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 6 + 4) * 8) =
       -0.025009377490697;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 6 + 5) * 8) =
       -0.352667734613656;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 6 + 6) * 8) =
       -0.147130125045907;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 6 + 7) * 8) =
       0.321485188311959;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 6 + 8) * 8) =
       -0.283247041628773;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 6 + 9) * 8) =
       0.21159185572358;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 6 + 10) * 8) =
       0.350015203834987;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 6 + 0xb) * 8) =
       -0.049893457330116;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 6 + 0xc) * 8) =
       0.331087436935406;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 6 + 0xd) * 8) =
       0.124020599512917;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 6 + 0xe) * 8) =
       -0.231097918395994;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 6 + 0xf) * 8) =
       -0.267570088225568;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + local_158.size_ * 7 * 8) =
       -0.169502524710522;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 7 + 1) * 8) =
       0.310272290281873;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 7 + 2) * 8) =
       0.297504919764693;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 7 + 3) * 8) =
       -0.191025712185045;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 7 + 4) * 8) =
       0.352667734613656;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 7 + 5) * 8) =
       -0.025009377490697;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 7 + 6) * 8) =
       -0.321485188311959;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 7 + 7) * 8) =
       -0.147130125045907;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 7 + 8) * 8) =
       -0.21159185572358;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 7 + 9) * 8) =
       -0.283247041628773;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 7 + 10) * 8) =
       0.049893457330116;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 7 + 0xb) * 8) =
       0.350015203834987;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 7 + 0xc) * 8) =
       -0.124020599512917;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 7 + 0xd) * 8) =
       0.331087436935406;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 7 + 0xe) * 8) =
       0.267570088225568;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 7 + 0xf) * 8) =
       -0.231097918395994;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + local_158.size_ * 8 * 8) =
       0.310272290281873;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 8 + 1) * 8) =
       0.169502524710522;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 8 + 2) * 8) =
       0.191025712185045;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 8 + 3) * 8) =
       0.297504919764693;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 8 + 4) * 8) =
       0.025009377490697;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 8 + 5) * 8) =
       0.352667734613656;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 8 + 6) * 8) =
       -0.147130125045907;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 8 + 7) * 8) =
       0.321485188311959;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 8 + 8) * 8) =
       0.283247041628773;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 8 + 9) * 8) =
       -0.21159185572358;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 8 + 10) * 8) =
       0.350015203834987;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 8 + 0xb) * 8) =
       -0.049893457330116;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 8 + 0xc) * 8) =
       0.331087436935406;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 8 + 0xd) * 8) =
       0.124020599512917;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 8 + 0xe) * 8) =
       0.231097918395994;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 8 + 0xf) * 8) =
       0.267570088225568;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + local_158.size_ * 9 * 8) =
       -0.169502524710522;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 9 + 1) * 8) =
       0.310272290281873;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 9 + 2) * 8) =
       -0.297504919764693;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 9 + 3) * 8) =
       0.191025712185045;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 9 + 4) * 8) =
       -0.352667734613656;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 9 + 5) * 8) =
       0.025009377490697;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 9 + 6) * 8) =
       -0.321485188311959;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 9 + 7) * 8) =
       -0.147130125045907;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 9 + 8) * 8) =
       0.21159185572358;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 9 + 9) * 8) =
       0.283247041628773;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 9 + 10) * 8) =
       0.049893457330116;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 9 + 0xb) * 8) =
       0.350015203834987;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 9 + 0xc) * 8) =
       -0.124020599512917;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 9 + 0xd) * 8) =
       0.331087436935406;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 9 + 0xe) * 8) =
       -0.267570088225568;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 9 + 0xf) * 8) =
       0.231097918395994;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + local_158.size_ * 10 * 8) =
       0.310272290281873;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 10 + 1) * 8) =
       0.169502524710522;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 10 + 2) * 8) =
       -0.191025712185045;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 10 + 3) * 8) =
       -0.297504919764693;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 10 + 4) * 8) =
       0.025009377490697;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 10 + 5) * 8) =
       0.352667734613656;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 10 + 6) * 8) =
       0.147130125045907;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 10 + 7) * 8) =
       -0.321485188311959;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 10 + 8) * 8) =
       0.283247041628773;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 10 + 9) * 8) =
       -0.21159185572358;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 10 + 10) * 8) =
       -0.350015203834987;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 10 + 0xb) * 8) =
       0.049893457330116;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 10 + 0xc) * 8) =
       0.331087436935406;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 10 + 0xd) * 8) =
       0.124020599512917;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 10 + 0xe) * 8) =
       -0.231097918395994;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 10 + 0xf) * 8) =
       -0.267570088225568;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + local_158.size_ * 0xb * 8) =
       -0.169502524710522;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xb + 1) * 8) =
       0.310272290281873;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xb + 2) * 8) =
       0.297504919764693;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xb + 3) * 8) =
       -0.191025712185045;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xb + 4) * 8) =
       -0.352667734613656;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xb + 5) * 8) =
       0.025009377490697;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xb + 6) * 8) =
       0.321485188311959;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xb + 7) * 8) =
       0.147130125045907;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xb + 8) * 8) =
       0.21159185572358;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xb + 9) * 8) =
       0.283247041628773;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xb + 10) * 8) =
       -0.049893457330116;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xb + 0xb) * 8) =
       -0.350015203834987;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xb + 0xc) * 8) =
       -0.124020599512917;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xb + 0xd) * 8) =
       0.331087436935406;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xb + 0xe) * 8) =
       0.267570088225568;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xb + 0xf) * 8) =
       -0.231097918395994;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + local_158.size_ * 0xc * 8) =
       0.310272290281873;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xc + 1) * 8) =
       0.169502524710522;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xc + 2) * 8) =
       0.191025712185045;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xc + 3) * 8) =
       0.297504919764693;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xc + 4) * 8) =
       -0.025009377490697;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xc + 5) * 8) =
       -0.352667734613656;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xc + 6) * 8) =
       0.147130125045907;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xc + 7) * 8) =
       -0.321485188311959;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xc + 8) * 8) =
       0.283247041628773;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xc + 9) * 8) =
       -0.21159185572358;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xc + 10) * 8) =
       0.350015203834987;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xc + 0xb) * 8) =
       -0.049893457330116;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xc + 0xc) * 8) =
       -0.331087436935406;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xc + 0xd) * 8) =
       -0.124020599512917;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xc + 0xe) * 8) =
       -0.231097918395994;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xc + 0xf) * 8) =
       -0.267570088225568;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + local_158.size_ * 0xd * 8) =
       -0.169502524710522;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xd + 1) * 8) =
       0.310272290281873;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xd + 2) * 8) =
       -0.297504919764693;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xd + 3) * 8) =
       0.191025712185045;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xd + 4) * 8) =
       0.352667734613656;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xd + 5) * 8) =
       -0.025009377490697;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xd + 6) * 8) =
       0.321485188311959;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xd + 7) * 8) =
       0.147130125045907;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xd + 8) * 8) =
       0.21159185572358;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xd + 9) * 8) =
       0.283247041628773;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xd + 10) * 8) =
       0.049893457330116;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xd + 0xb) * 8) =
       0.350015203834987;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xd + 0xc) * 8) =
       0.124020599512917;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xd + 0xd) * 8) =
       -0.331087436935406;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xd + 0xe) * 8) =
       0.267570088225568;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xd + 0xf) * 8) =
       -0.231097918395994;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + local_158.size_ * 0xe * 8) =
       0.310272290281873;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xe + 1) * 8) =
       0.169502524710522;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xe + 2) * 8) =
       -0.191025712185045;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xe + 3) * 8) =
       -0.297504919764693;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xe + 4) * 8) =
       -0.025009377490697;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xe + 5) * 8) =
       -0.352667734613656;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xe + 6) * 8) =
       -0.147130125045907;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xe + 7) * 8) =
       0.321485188311959;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xe + 8) * 8) =
       0.283247041628773;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xe + 9) * 8) =
       -0.21159185572358;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xe + 10) * 8) =
       -0.350015203834987;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xe + 0xb) * 8) =
       0.049893457330116;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xe + 0xc) * 8) =
       -0.331087436935406;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xe + 0xd) * 8) =
       -0.124020599512917;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xe + 0xe) * 8) =
       0.231097918395994;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xe + 0xf) * 8) =
       0.267570088225568;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + local_158.size_ * 0xf * 8) =
       -0.169502524710522;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xf + 1) * 8) =
       0.310272290281873;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xf + 2) * 8) =
       0.297504919764693;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xf + 3) * 8) =
       -0.191025712185045;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xf + 4) * 8) =
       0.352667734613656;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xf + 5) * 8) =
       -0.025009377490697;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xf + 6) * 8) =
       -0.321485188311959;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xf + 7) * 8) =
       -0.147130125045907;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xf + 8) * 8) =
       0.21159185572358;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xf + 9) * 8) =
       0.283247041628773;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xf + 10) * 8) =
       -0.049893457330116;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xf + 0xb) * 8) =
       -0.350015203834987;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xf + 0xc) * 8) =
       0.124020599512917;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xf + 0xd) * 8) =
       -0.331087436935406;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xf + 0xe) * 8) =
       -0.267570088225568;
  *(double *)
   ((long)local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + (local_158.size_ * 0xf + 0xf) * 8) =
       0.231097918395994;
  qclab::QCircuit<double,_qclab::QObject<double>_>::matrix
            ((QCircuit<double,_qclab::QObject<double>_> *)local_128);
  test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>,double>
            ((SquareMatrix<double> *)local_128,&local_158,2.220446049250313e-15);
  if ((__uniq_ptr_impl<double,_std::default_delete<double[]>_>)local_128._8_8_ !=
      (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
    operator_delete__((void *)local_128._8_8_);
  }
  if ((_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)
      local_158.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl != (double *)0x0) {
    operator_delete__((void *)local_158.data_._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  local_118 = (undefined1  [8])&PTR_nbQubits_0018bd90;
  std::
  vector<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
  ::~vector(&vStack_100);
  if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_148.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
    operator_delete__((void *)local_148.data_._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  local_90.super_QObject<double>._vptr_QObject = (_func_int **)&PTR_nbQubits_0018bd90;
  std::
  vector<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
  ::~vector(&local_90.gates_);
  if (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_138.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
    operator_delete__((void *)local_138.data_._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  local_60.super_QObject<double>._vptr_QObject = (_func_int **)&PTR_nbQubits_0018bd90;
  std::
  vector<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
  ::~vector(&local_60.gates_);
  if (local_a8[0] != (void *)0x0) {
    operator_delete(local_a8[0],local_98 - (long)local_a8[0]);
  }
  return;
}

Assistant:

void test_qpixl_frqi_compressedFRQICircuit() {
  const R eps = std::numeric_limits< R >::epsilon() ;

  std::vector< R > a = { 0.5 , 1 } ;

  auto circA = qpixl::frqi::compressedFRQICircuit( a ) ;

  // matrix
  qclab::dense::SquareMatrix< R > circA_check(    
  0.620544580563746, -0.339005049421045,  0.620544580563746, -0.339005049421045,
  0.339005049421045,  0.620544580563746,  0.339005049421045,  0.620544580563746,
  0.382051424370090, -0.595009839529386, -0.382051424370090,  0.595009839529386,
  0.595009839529386,  0.382051424370090, -0.595009839529386, -0.382051424370090
  ) ;

  test_qpixl_frqi_check_matrix( circA.matrix() , circA_check  , 10*eps );
  
  
  std::vector< R > b = { 0.5 , 1 , 1.5 , 2 };

  auto circB = qpixl::frqi::compressedFRQICircuit( b ) ;

  // matrix
  qclab::dense::SquareMatrix< R > circB_check( 8 ) ;

  circB_check( 0, 0 ) =  0.438791280945186 ;
  circB_check( 1, 0 ) =  0.239712769302101 ;
  circB_check( 2, 0 ) =  0.270151152934070 ;
  circB_check( 3, 0 ) =  0.420735492403948 ;
  circB_check( 4, 0 ) =  0.035368600833851 ;
  circB_check( 5, 0 ) =  0.498747493302027 ;
  circB_check( 6, 0 ) = -0.208073418273571 ;
  circB_check( 7, 0 ) =  0.454648713412841 ;

  circB_check( 0, 1 ) = -0.239712769302101 ;
  circB_check( 1, 1 ) =  0.438791280945186 ;
  circB_check( 2, 1 ) = -0.420735492403948 ;
  circB_check( 3, 1 ) =  0.270151152934070 ;
  circB_check( 4, 1 ) = -0.498747493302027 ;
  circB_check( 5, 1 ) =  0.035368600833851 ;
  circB_check( 6, 1 ) = -0.454648713412841 ;
  circB_check( 7, 1 ) = -0.208073418273571 ;

  circB_check( 0, 2 ) =  0.438791280945186 ;
  circB_check( 1, 2 ) =  0.239712769302101 ;
  circB_check( 2, 2 ) = -0.270151152934070 ;
  circB_check( 3, 2 ) = -0.420735492403948 ;
  circB_check( 4, 2 ) =  0.035368600833851 ;
  circB_check( 5, 2 ) =  0.498747493302027 ;
  circB_check( 6, 2 ) =  0.208073418273571 ;
  circB_check( 7, 2 ) = -0.454648713412841 ;

  circB_check( 0, 3 ) = -0.239712769302101 ;
  circB_check( 1, 3 ) =  0.438791280945186 ;
  circB_check( 2, 3 ) =  0.420735492403948 ;
  circB_check( 3, 3 ) = -0.270151152934070 ;
  circB_check( 4, 3 ) = -0.498747493302027 ;
  circB_check( 5, 3 ) =  0.035368600833851 ;
  circB_check( 6, 3 ) =  0.454648713412841 ;
  circB_check( 7, 3 ) =  0.208073418273571 ;

  circB_check( 0, 4 ) =  0.438791280945186 ;
  circB_check( 1, 4 ) =  0.239712769302101 ;
  circB_check( 2, 4 ) =  0.270151152934070 ;
  circB_check( 3, 4 ) =  0.420735492403948 ;
  circB_check( 4, 4 ) = -0.035368600833851 ;
  circB_check( 5, 4 ) = -0.498747493302027 ;
  circB_check( 6, 4 ) =  0.208073418273571 ;
  circB_check( 7, 4 ) = -0.454648713412841 ;

  circB_check( 0, 5 ) = -0.239712769302101 ;
  circB_check( 1, 5 ) =  0.438791280945186 ;
  circB_check( 2, 5 ) = -0.420735492403948 ;
  circB_check( 3, 5 ) =  0.270151152934070 ;
  circB_check( 4, 5 ) =  0.498747493302027 ;
  circB_check( 5, 5 ) = -0.035368600833851 ;
  circB_check( 6, 5 ) =  0.454648713412841 ;
  circB_check( 7, 5 ) =  0.208073418273571 ;

  circB_check( 0, 6 ) =  0.438791280945186 ;
  circB_check( 1, 6 ) =  0.239712769302101 ;
  circB_check( 2, 6 ) = -0.270151152934070 ;
  circB_check( 3, 6 ) = -0.420735492403948 ;
  circB_check( 4, 6 ) = -0.035368600833851 ;
  circB_check( 5, 6 ) = -0.498747493302027 ;
  circB_check( 6, 6 ) = -0.208073418273571 ;
  circB_check( 7, 6 ) =  0.454648713412841 ;

  circB_check( 0, 7 ) = -0.239712769302101 ;
  circB_check( 1, 7 ) =  0.438791280945186 ;
  circB_check( 2, 7 ) =  0.420735492403948 ;
  circB_check( 3, 7 ) = -0.270151152934070 ;
  circB_check( 4, 7 ) =  0.498747493302027 ;
  circB_check( 5, 7 ) = -0.035368600833851 ;
  circB_check( 6, 7 ) = -0.454648713412841 ;
  circB_check( 7, 7 ) = -0.208073418273571 ;


  test_qpixl_frqi_check_matrix( circB.matrix() , circB_check  , 10*eps );



  std::vector< R > c = { 0.5 , 1 , 1.5 , 2 , 2.5 , 3 , 3.5 , 4 };

  auto circC = qpixl::frqi::compressedFRQICircuit( c ) ;  

  // matrix
  qclab::dense::SquareMatrix< R > circC_check( 16 ) ;

  circC_check(  0, 0 ) =    0.310272290281873 ;
  circC_check(  1, 0 ) =    0.169502524710522 ;
  circC_check(  2, 0 ) =    0.191025712185045 ;
  circC_check(  3, 0 ) =    0.297504919764693 ;
  circC_check(  4, 0 ) =    0.025009377490697 ;
  circC_check(  5, 0 ) =    0.352667734613656 ;
  circC_check(  6, 0 ) =   -0.147130125045907 ;
  circC_check(  7, 0 ) =    0.321485188311959 ;
  circC_check(  8, 0 ) =   -0.283247041628773 ;
  circC_check(  9, 0 ) =    0.211591855723580 ;
  circC_check( 10, 0 ) =   -0.350015203834987 ;
  circC_check( 11, 0 ) =    0.049893457330116 ;
  circC_check( 12, 0 ) =   -0.331087436935406 ;
  circC_check( 13, 0 ) =   -0.124020599512917 ;
  circC_check( 14, 0 ) =   -0.231097918395994 ;
  circC_check( 15, 0 ) =   -0.267570088225568 ;

  circC_check(  0, 1 ) =   -0.169502524710522 ;
  circC_check(  1, 1 ) =    0.310272290281873 ;
  circC_check(  2, 1 ) =   -0.297504919764693 ;
  circC_check(  3, 1 ) =    0.191025712185045 ;
  circC_check(  4, 1 ) =   -0.352667734613656 ;
  circC_check(  5, 1 ) =    0.025009377490697 ;
  circC_check(  6, 1 ) =   -0.321485188311959 ;
  circC_check(  7, 1 ) =   -0.147130125045907 ;
  circC_check(  8, 1 ) =   -0.211591855723580 ;
  circC_check(  9, 1 ) =   -0.283247041628773 ;
  circC_check( 10, 1 ) =   -0.049893457330116 ;
  circC_check( 11, 1 ) =   -0.350015203834987 ;
  circC_check( 12, 1 ) =    0.124020599512917 ;
  circC_check( 13, 1 ) =   -0.331087436935406 ;
  circC_check( 14, 1 ) =    0.267570088225568 ;
  circC_check( 15, 1 ) =   -0.231097918395994 ;

  circC_check(  0, 2 ) =    0.310272290281873 ;
  circC_check(  1, 2 ) =    0.169502524710522 ;
  circC_check(  2, 2 ) =   -0.191025712185045 ;
  circC_check(  3, 2 ) =   -0.297504919764693 ;
  circC_check(  4, 2 ) =    0.025009377490697 ;
  circC_check(  5, 2 ) =    0.352667734613656 ;
  circC_check(  6, 2 ) =    0.147130125045907 ;
  circC_check(  7, 2 ) =   -0.321485188311959 ;
  circC_check(  8, 2 ) =   -0.283247041628773 ;
  circC_check(  9, 2 ) =    0.211591855723580 ;
  circC_check( 10, 2 ) =    0.350015203834987 ;
  circC_check( 11, 2 ) =   -0.049893457330116 ;
  circC_check( 12, 2 ) =   -0.331087436935406 ;
  circC_check( 13, 2 ) =   -0.124020599512917 ;
  circC_check( 14, 2 ) =    0.231097918395994 ;
  circC_check( 15, 2 ) =    0.267570088225568 ;

  circC_check(  0, 3 ) =   -0.169502524710522 ;
  circC_check(  1, 3 ) =    0.310272290281873 ;
  circC_check(  2, 3 ) =    0.297504919764693 ;
  circC_check(  3, 3 ) =   -0.191025712185045 ;
  circC_check(  4, 3 ) =   -0.352667734613656 ;
  circC_check(  5, 3 ) =    0.025009377490697 ;
  circC_check(  6, 3 ) =    0.321485188311959 ;
  circC_check(  7, 3 ) =    0.147130125045907 ;
  circC_check(  8, 3 ) =   -0.211591855723580 ;
  circC_check(  9, 3 ) =   -0.283247041628773 ;
  circC_check( 10, 3 ) =    0.049893457330116 ;
  circC_check( 11, 3 ) =    0.350015203834987 ;
  circC_check( 12, 3 ) =    0.124020599512917 ;
  circC_check( 13, 3 ) =   -0.331087436935406 ;
  circC_check( 14, 3 ) =   -0.267570088225568 ;
  circC_check( 15, 3 ) =    0.231097918395994 ;

  circC_check(  0, 4 ) =    0.310272290281873 ;
  circC_check(  1, 4 ) =    0.169502524710522 ;
  circC_check(  2, 4 ) =    0.191025712185045 ;
  circC_check(  3, 4 ) =    0.297504919764693 ;
  circC_check(  4, 4 ) =   -0.025009377490697 ;
  circC_check(  5, 4 ) =   -0.352667734613656 ;
  circC_check(  6, 4 ) =    0.147130125045907 ;
  circC_check(  7, 4 ) =   -0.321485188311959 ;
  circC_check(  8, 4 ) =   -0.283247041628773 ;
  circC_check(  9, 4 ) =    0.211591855723580 ;
  circC_check( 10, 4 ) =   -0.350015203834987 ;
  circC_check( 11, 4 ) =    0.049893457330116 ;
  circC_check( 12, 4 ) =    0.331087436935406 ;
  circC_check( 13, 4 ) =    0.124020599512917 ;
  circC_check( 14, 4 ) =    0.231097918395994 ;
  circC_check( 15, 4 ) =    0.267570088225568 ;

  circC_check(  0, 5 ) =   -0.169502524710522 ;
  circC_check(  1, 5 ) =    0.310272290281873 ;
  circC_check(  2, 5 ) =   -0.297504919764693 ;
  circC_check(  3, 5 ) =    0.191025712185045 ;
  circC_check(  4, 5 ) =    0.352667734613656 ;
  circC_check(  5, 5 ) =   -0.025009377490697 ;
  circC_check(  6, 5 ) =    0.321485188311959 ;
  circC_check(  7, 5 ) =    0.147130125045907 ;
  circC_check(  8, 5 ) =   -0.211591855723580 ;
  circC_check(  9, 5 ) =   -0.283247041628773 ;
  circC_check( 10, 5 ) =   -0.049893457330116 ;
  circC_check( 11, 5 ) =   -0.350015203834987 ;
  circC_check( 12, 5 ) =   -0.124020599512917 ;
  circC_check( 13, 5 ) =    0.331087436935406 ;
  circC_check( 14, 5 ) =   -0.267570088225568 ;
  circC_check( 15, 5 ) =    0.231097918395994 ;

  circC_check(  0, 6 ) =    0.310272290281873 ;
  circC_check(  1, 6 ) =    0.169502524710522 ;
  circC_check(  2, 6 ) =   -0.191025712185045 ;
  circC_check(  3, 6 ) =   -0.297504919764693 ;
  circC_check(  4, 6 ) =   -0.025009377490697 ;
  circC_check(  5, 6 ) =   -0.352667734613656 ;
  circC_check(  6, 6 ) =   -0.147130125045907 ;
  circC_check(  7, 6 ) =    0.321485188311959 ;
  circC_check(  8, 6 ) =   -0.283247041628773 ;
  circC_check(  9, 6 ) =    0.211591855723580 ;
  circC_check( 10, 6 ) =    0.350015203834987 ;
  circC_check( 11, 6 ) =   -0.049893457330116 ;
  circC_check( 12, 6 ) =    0.331087436935406 ;
  circC_check( 13, 6 ) =    0.124020599512917 ;
  circC_check( 14, 6 ) =   -0.231097918395994 ;
  circC_check( 15, 6 ) =   -0.267570088225568 ;

  circC_check(  0, 7 ) =   -0.169502524710522 ;
  circC_check(  1, 7 ) =    0.310272290281873 ;
  circC_check(  2, 7 ) =    0.297504919764693 ;
  circC_check(  3, 7 ) =   -0.191025712185045 ;
  circC_check(  4, 7 ) =    0.352667734613656 ;
  circC_check(  5, 7 ) =   -0.025009377490697 ;
  circC_check(  6, 7 ) =   -0.321485188311959 ;
  circC_check(  7, 7 ) =   -0.147130125045907 ;
  circC_check(  8, 7 ) =   -0.211591855723580 ;
  circC_check(  9, 7 ) =   -0.283247041628773 ;
  circC_check( 10, 7 ) =    0.049893457330116 ;
  circC_check( 11, 7 ) =    0.350015203834987 ;
  circC_check( 12, 7 ) =   -0.124020599512917 ;
  circC_check( 13, 7 ) =    0.331087436935406 ;
  circC_check( 14, 7 ) =    0.267570088225568 ;
  circC_check( 15, 7 ) =   -0.231097918395994 ;

  circC_check(  0, 8 ) =    0.310272290281873 ;
  circC_check(  1, 8 ) =    0.169502524710522 ;
  circC_check(  2, 8 ) =    0.191025712185045 ;
  circC_check(  3, 8 ) =    0.297504919764693 ;
  circC_check(  4, 8 ) =    0.025009377490697 ;
  circC_check(  5, 8 ) =    0.352667734613656 ;
  circC_check(  6, 8 ) =   -0.147130125045907 ;
  circC_check(  7, 8 ) =    0.321485188311959 ;
  circC_check(  8, 8 ) =    0.283247041628773 ;
  circC_check(  9, 8 ) =   -0.211591855723580 ;
  circC_check( 10, 8 ) =    0.350015203834987 ;
  circC_check( 11, 8 ) =   -0.049893457330116 ;
  circC_check( 12, 8 ) =    0.331087436935406 ;
  circC_check( 13, 8 ) =    0.124020599512917 ;
  circC_check( 14, 8 ) =    0.231097918395994 ;
  circC_check( 15, 8 ) =    0.267570088225568 ;

  circC_check(  0, 9 ) =   -0.169502524710522 ;
  circC_check(  1, 9 ) =    0.310272290281873 ;
  circC_check(  2, 9 ) =   -0.297504919764693 ;
  circC_check(  3, 9 ) =    0.191025712185045 ;
  circC_check(  4, 9 ) =   -0.352667734613656 ;
  circC_check(  5, 9 ) =    0.025009377490697 ;
  circC_check(  6, 9 ) =   -0.321485188311959 ;
  circC_check(  7, 9 ) =   -0.147130125045907 ;
  circC_check(  8, 9 ) =    0.211591855723580 ;
  circC_check(  9, 9 ) =    0.283247041628773 ;
  circC_check( 10, 9 ) =    0.049893457330116 ;
  circC_check( 11, 9 ) =    0.350015203834987 ;
  circC_check( 12, 9 ) =   -0.124020599512917 ;
  circC_check( 13, 9 ) =    0.331087436935406 ;
  circC_check( 14, 9 ) =   -0.267570088225568 ;
  circC_check( 15, 9 ) =    0.231097918395994 ;

  circC_check(  0, 10 ) =    0.310272290281873 ;
  circC_check(  1, 10 ) =    0.169502524710522 ;
  circC_check(  2, 10 ) =   -0.191025712185045 ;
  circC_check(  3, 10 ) =   -0.297504919764693 ;
  circC_check(  4, 10 ) =    0.025009377490697 ;
  circC_check(  5, 10 ) =    0.352667734613656 ;
  circC_check(  6, 10 ) =    0.147130125045907 ;
  circC_check(  7, 10 ) =   -0.321485188311959 ;
  circC_check(  8, 10 ) =    0.283247041628773 ;
  circC_check(  9, 10 ) =   -0.211591855723580 ;
  circC_check( 10, 10 ) =   -0.350015203834987 ;
  circC_check( 11, 10 ) =    0.049893457330116 ;
  circC_check( 12, 10 ) =    0.331087436935406 ;
  circC_check( 13, 10 ) =    0.124020599512917 ;
  circC_check( 14, 10 ) =   -0.231097918395994 ;
  circC_check( 15, 10 ) =   -0.267570088225568 ;

  circC_check(  0, 11 ) =   -0.169502524710522 ;
  circC_check(  1, 11 ) =    0.310272290281873 ;
  circC_check(  2, 11 ) =    0.297504919764693 ;
  circC_check(  3, 11 ) =   -0.191025712185045 ;
  circC_check(  4, 11 ) =   -0.352667734613656 ;
  circC_check(  5, 11 ) =    0.025009377490697 ;
  circC_check(  6, 11 ) =    0.321485188311959 ;
  circC_check(  7, 11 ) =    0.147130125045907 ;
  circC_check(  8, 11 ) =    0.211591855723580 ;
  circC_check(  9, 11 ) =    0.283247041628773 ;
  circC_check( 10, 11 ) =   -0.049893457330116 ;
  circC_check( 11, 11 ) =   -0.350015203834987 ;
  circC_check( 12, 11 ) =   -0.124020599512917 ;
  circC_check( 13, 11 ) =    0.331087436935406 ;
  circC_check( 14, 11 ) =    0.267570088225568 ;
  circC_check( 15, 11 ) =   -0.231097918395994 ;

  circC_check(  0, 12 ) =    0.310272290281873 ;
  circC_check(  1, 12 ) =    0.169502524710522 ;
  circC_check(  2, 12 ) =    0.191025712185045 ;
  circC_check(  3, 12 ) =    0.297504919764693 ;
  circC_check(  4, 12 ) =   -0.025009377490697 ;
  circC_check(  5, 12 ) =   -0.352667734613656 ;
  circC_check(  6, 12 ) =    0.147130125045907 ;
  circC_check(  7, 12 ) =   -0.321485188311959 ;
  circC_check(  8, 12 ) =    0.283247041628773 ;
  circC_check(  9, 12 ) =   -0.211591855723580 ;
  circC_check( 10, 12 ) =    0.350015203834987 ;
  circC_check( 11, 12 ) =   -0.049893457330116 ;
  circC_check( 12, 12 ) =   -0.331087436935406 ;
  circC_check( 13, 12 ) =   -0.124020599512917 ;
  circC_check( 14, 12 ) =   -0.231097918395994 ;
  circC_check( 15, 12 ) =   -0.267570088225568 ;

  circC_check(  0, 13 ) =   -0.169502524710522 ;
  circC_check(  1, 13 ) =    0.310272290281873 ;
  circC_check(  2, 13 ) =   -0.297504919764693 ;
  circC_check(  3, 13 ) =    0.191025712185045 ;
  circC_check(  4, 13 ) =    0.352667734613656 ;
  circC_check(  5, 13 ) =   -0.025009377490697 ;
  circC_check(  6, 13 ) =    0.321485188311959 ;
  circC_check(  7, 13 ) =    0.147130125045907 ;
  circC_check(  8, 13 ) =    0.211591855723580 ;
  circC_check(  9, 13 ) =    0.283247041628773 ;
  circC_check( 10, 13 ) =    0.049893457330116 ;
  circC_check( 11, 13 ) =    0.350015203834987 ;
  circC_check( 12, 13 ) =    0.124020599512917 ;
  circC_check( 13, 13 ) =   -0.331087436935406 ;
  circC_check( 14, 13 ) =    0.267570088225568 ;
  circC_check( 15, 13 ) =   -0.231097918395994 ;

  circC_check(  0, 14 ) =    0.310272290281873 ;
  circC_check(  1, 14 ) =    0.169502524710522 ;
  circC_check(  2, 14 ) =   -0.191025712185045 ;
  circC_check(  3, 14 ) =   -0.297504919764693 ;
  circC_check(  4, 14 ) =   -0.025009377490697 ;
  circC_check(  5, 14 ) =   -0.352667734613656 ;
  circC_check(  6, 14 ) =   -0.147130125045907 ;
  circC_check(  7, 14 ) =    0.321485188311959 ;
  circC_check(  8, 14 ) =    0.283247041628773 ;
  circC_check(  9, 14 ) =   -0.211591855723580 ;
  circC_check( 10, 14 ) =   -0.350015203834987 ;
  circC_check( 11, 14 ) =    0.049893457330116 ;
  circC_check( 12, 14 ) =   -0.331087436935406 ;
  circC_check( 13, 14 ) =   -0.124020599512917 ;
  circC_check( 14, 14 ) =    0.231097918395994 ;
  circC_check( 15, 14 ) =    0.267570088225568 ;

  circC_check(  0, 15 ) =   -0.169502524710522 ;
  circC_check(  1, 15 ) =    0.310272290281873 ;
  circC_check(  2, 15 ) =    0.297504919764693 ;
  circC_check(  3, 15 ) =   -0.191025712185045 ;
  circC_check(  4, 15 ) =    0.352667734613656 ;
  circC_check(  5, 15 ) =   -0.025009377490697 ;
  circC_check(  6, 15 ) =   -0.321485188311959 ;
  circC_check(  7, 15 ) =   -0.147130125045907 ;
  circC_check(  8, 15 ) =    0.211591855723580 ;
  circC_check(  9, 15 ) =    0.283247041628773 ;
  circC_check( 10, 15 ) =   -0.049893457330116 ;
  circC_check( 11, 15 ) =   -0.350015203834987 ;
  circC_check( 12, 15 ) =    0.124020599512917 ;
  circC_check( 13, 15 ) =   -0.331087436935406 ;
  circC_check( 14, 15 ) =   -0.267570088225568 ;
  circC_check( 15, 15 ) =    0.231097918395994 ;

  test_qpixl_frqi_check_matrix( circC.matrix() , circC_check  , 10*eps );
}